

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elim.cpp
# Opt level: O2

int __thiscall
CaDiCaL::Internal::elim_round(Internal *this,bool *completed,bool *deleted_binary_clause)

{
  byte *pbVar1;
  long *plVar2;
  char cVar3;
  int iVar4;
  Flags FVar5;
  pointer ppCVar6;
  Clause *c;
  pointer pFVar7;
  value_type pCVar8;
  int64_t iVar9;
  int64_t iVar10;
  pointer puVar11;
  pointer puVar12;
  byte bVar13;
  bool bVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  long lVar19;
  time_t *__timer;
  Internal *pIVar20;
  Clause *__range3;
  uint uVar21;
  Clause *__range2;
  pointer ppCVar22;
  long lVar23;
  double s;
  double dVar24;
  double s_00;
  int local_158;
  long local_150;
  Instantiator instantiator;
  Eliminator eliminator;
  
  time(this,(time_t *)completed);
  pIVar20 = this->internal;
  iVar4 = (pIVar20->opts).profile;
  if ((this->preprocessing == false) && (this->lookingahead == false)) {
    bVar13 = this->stable;
    if (((bool)bVar13 == true) && ((pIVar20->profiles).stable.level <= iVar4)) {
      stop_profiling(pIVar20,&(pIVar20->profiles).stable,s);
      bVar13 = this->stable;
      pIVar20 = this->internal;
    }
    if (((bVar13 & 1) == 0) && ((pIVar20->profiles).unstable.level <= iVar4)) {
      stop_profiling(pIVar20,&(pIVar20->profiles).unstable,s);
      pIVar20 = this->internal;
    }
    if ((pIVar20->profiles).search.level <= iVar4) {
      stop_profiling(pIVar20,&(pIVar20->profiles).search,s);
      pIVar20 = this->internal;
    }
    pbVar1 = (byte *)((long)&this->mode + 1);
    *pbVar1 = *pbVar1 & 0xfe;
  }
  if ((pIVar20->profiles).simplify.level <= iVar4) {
    start_profiling(pIVar20,&(pIVar20->profiles).simplify,s);
    pIVar20 = this->internal;
  }
  if ((pIVar20->profiles).elim.level <= iVar4) {
    start_profiling(pIVar20,&(pIVar20->profiles).elim,s);
  }
  this->mode = this->mode | 0x220;
  lVar19 = (this->stats).elimrounds + 1;
  (this->stats).elimrounds = lVar19;
  (this->last).elim.marked = (this->stats).mark.elim;
  if ((this->opts).elimlimited == 0) {
    local_150 = 0x7fffffffffffffff;
    if (this->internal != (Internal *)0x0) {
      phase(this->internal,"elim-round",lVar19,"resolutions unlimited");
    }
  }
  else {
    lVar16 = (long)((double)(this->stats).propagations.search *
                   (double)(this->opts).elimreleff * 0.001);
    lVar17 = (long)(this->opts).elimineff;
    if (lVar17 < lVar16) {
      lVar17 = lVar16;
    }
    lVar16 = (long)(this->opts).elimaxeff;
    if (lVar16 <= lVar17) {
      lVar17 = lVar16;
    }
    lVar16 = (long)(int)(this->stats).active;
    local_150 = lVar16 * 2;
    if (lVar17 != local_150 && SBORROW8(lVar17,local_150) == lVar17 + lVar16 * -2 < 0) {
      local_150 = lVar17;
    }
    if (this->internal != (Internal *)0x0) {
      phase(this->internal,"elim-round",lVar19,"limit of %ld resolutions",local_150);
    }
    local_150 = local_150 + (this->stats).elimres;
  }
  init_noccs(this);
  ppCVar6 = (this->clauses).
            super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar22 = (this->clauses).
                  super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppCVar22 != ppCVar6; ppCVar22 = ppCVar22 + 1) {
    c = *ppCVar22;
    if ((*(ushort *)&c->field_0x8 & 0x810) == 0) {
      lVar17 = (long)c->size * 4;
      bVar14 = false;
      bVar18 = false;
      for (lVar19 = 0; lVar17 != lVar19; lVar19 = lVar19 + 4) {
        cVar3 = this->vals[*(int *)((long)&c[1].field_0 + lVar19)];
        if (cVar3 < '\x01') {
          bVar14 = (bool)(cVar3 < '\0' | bVar14);
        }
        bVar18 = (bool)(bVar18 | '\0' < cVar3);
      }
      if (bVar18) {
        mark_garbage(this,c);
      }
      else {
        for (lVar19 = 0; lVar17 != lVar19; lVar19 = lVar19 + 4) {
          uVar21 = *(uint *)((long)&c[1].field_0 + lVar19);
          uVar15 = -uVar21;
          if (0 < (int)uVar21) {
            uVar15 = uVar21;
          }
          if (((uint)(this->ftab).
                     super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar15] & 0x7000000) == 0x1000000) {
            if (bVar14) {
              mark_elim(this,uVar21);
              uVar21 = *(uint *)((long)&c[1].field_0 + lVar19);
              uVar15 = -uVar21;
              if (0 < (int)uVar21) {
                uVar15 = uVar21;
              }
            }
            plVar2 = (this->ntab).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start + (uVar15 << 1 | uVar21 >> 0x1f);
            *plVar2 = *plVar2 + 1;
          }
        }
      }
    }
  }
  init_occs(this);
  Eliminator::Eliminator(&eliminator,this);
  iVar4 = *(this->vars).n;
  for (uVar21 = 1; uVar21 - iVar4 != 1; uVar21 = uVar21 + 1) {
    uVar15 = -uVar21;
    if (0 < (int)uVar21) {
      uVar15 = uVar21;
    }
    if ((((uint)(this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar15] & 0x7000000) == 0x1000000) &&
       (bVar14 = frozen(this,uVar21), !bVar14)) {
      pFVar7 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
               _M_impl.super__Vector_impl_data._M_start;
      FVar5 = pFVar7[uVar15];
      if (((uint)FVar5 >> 8 & 1) != 0) {
        pFVar7[uVar15] = (Flags)((uint)FVar5 & 0xfffffeff);
        heap<CaDiCaL::elim_more>::push_back(&eliminator.schedule,uVar21);
      }
    }
  }
  heap<CaDiCaL::elim_more>::shrink(&eliminator.schedule);
  puVar12 = eliminator.schedule.array.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  puVar11 = eliminator.schedule.array.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar19 = (long)eliminator.schedule.array.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)eliminator.schedule.array.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  if (this->internal != (Internal *)0x0) {
    iVar4 = (int)(this->stats).active;
    dVar24 = 0.0;
    if (iVar4 != 0) {
      dVar24 = ((double)lVar19 * 100.0) / (double)iVar4;
    }
    phase(this->internal,"elim-round",(this->stats).elimrounds,
          "scheduled %ld variables %.0f%% for elimination",dVar24,lVar19);
  }
  ppCVar6 = (this->clauses).
            super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar22 = (this->clauses).
                  super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppCVar22 != ppCVar6; ppCVar22 = ppCVar22 + 1) {
    pCVar8 = *ppCVar22;
    if ((*(ushort *)&pCVar8->field_0x8 & 0x810) == 0) {
      iVar4 = pCVar8->size;
      for (lVar17 = 0; (long)iVar4 * 4 != lVar17; lVar17 = lVar17 + 4) {
        uVar21 = *(uint *)((long)&pCVar8[1].field_0 + lVar17);
        uVar15 = -uVar21;
        if (0 < (int)uVar21) {
          uVar15 = uVar21;
        }
        if (((uint)(this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar15] & 0x7000000) == 0x1000000) {
          std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::push_back
                    ((this->otab).
                     super__Vector_base<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>,_std::allocator<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (uVar15 << 1 | uVar21 >> 0x1f),
                     ppCVar22);
        }
      }
    }
  }
  lVar17 = (this->stats).elimres;
  lVar16 = (this->stats).irrlits;
  iVar9 = (this->stats).all.eliminated;
  iVar10 = (this->stats).all.fixed;
  lVar23 = 0;
  while (((this->unsat != true &&
          (bVar14 = terminated_asynchronously(this,1), !bVar14 && (this->stats).elimres <= local_150
          )) && (eliminator.schedule.array.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start !=
                 eliminator.schedule.array.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish))) {
    uVar21 = *eliminator.schedule.array.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    heap<CaDiCaL::elim_more>::pop_front(&eliminator.schedule);
    uVar15 = -uVar21;
    if (0 < (int)uVar21) {
      uVar15 = uVar21;
    }
    pFVar7 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
             _M_impl.super__Vector_impl_data._M_start + uVar15;
    *pFVar7 = (Flags)((uint)*pFVar7 & 0xfffffeff);
    try_to_eliminate_variable(this,&eliminator,uVar21,deleted_binary_clause);
    if ((lVar16 * 2) / 3 + 0x100000 < (this->stats).garbage.literals) {
      mark_redundant_clauses_with_eliminated_variables_as_garbage(this);
      garbage_collection(this);
    }
    lVar23 = lVar23 + 1;
  }
  *completed = (long)eliminator.schedule.array.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)eliminator.schedule.array.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start == 0;
  if (this->internal != (Internal *)0x0) {
    dVar24 = 0.0;
    if (puVar12 != puVar11) {
      dVar24 = ((double)lVar23 * 100.0) / (double)lVar19;
    }
    phase(this->internal,"elim-round",(this->stats).elimrounds,
          "tried to eliminate %ld variables %.0f%% (%zd remain)",dVar24,lVar23,
          (long)eliminator.schedule.array.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)eliminator.schedule.array.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2);
  }
  heap<CaDiCaL::elim_more>::erase(&eliminator.schedule);
  instantiator.candidates.
  super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  instantiator.candidates.
  super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  instantiator.candidates.
  super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->unsat == false) &&
     (bVar14 = terminated_asynchronously(this,1), !bVar14 && (this->opts).instantiate != 0)) {
    collect_instantiation_candidates(this,&instantiator);
  }
  reset_occs(this);
  reset_noccs(this);
  if (this->unsat == false) {
    mark_redundant_clauses_with_eliminated_variables_as_garbage(this);
  }
  local_158 = (int)iVar9;
  uVar21 = (int)(this->stats).all.eliminated - local_158;
  if (this->internal != (Internal *)0x0) {
    dVar24 = 0.0;
    if (puVar12 != puVar11) {
      dVar24 = ((double)(int)uVar21 * 100.0) / (double)lVar19;
    }
    phase(this->internal,"elim-round",(this->stats).elimrounds,
          "eliminated %d variables %.0f%% in %ld resolutions",dVar24,(ulong)uVar21,
          (this->stats).elimres - lVar17);
  }
  (this->last).elim.subsumephases = (this->stats).subsumephases;
  __timer = (time_t *)0x65;
  report(this,'e',(uint)((int)iVar10 - (int)(this->stats).all.fixed == uVar21 &&
                        (this->opts).reportall == 0));
  time(this,__timer);
  pIVar20 = this->internal;
  iVar4 = (pIVar20->opts).profile;
  if ((pIVar20->profiles).elim.level <= iVar4) {
    stop_profiling(pIVar20,&(pIVar20->profiles).elim,s_00);
    pIVar20 = this->internal;
  }
  if ((pIVar20->profiles).simplify.level <= iVar4) {
    stop_profiling(pIVar20,&(pIVar20->profiles).simplify,s_00);
  }
  this->mode = this->mode & 0xfffffddf;
  if ((this->preprocessing == false) && (this->lookingahead == false)) {
    pIVar20 = this->internal;
    if ((pIVar20->profiles).search.level <= iVar4) {
      start_profiling(pIVar20,&(pIVar20->profiles).search,s_00);
    }
    bVar13 = this->stable;
    if (((bool)bVar13 == true) &&
       (pIVar20 = this->internal, (pIVar20->profiles).stable.level <= iVar4)) {
      start_profiling(pIVar20,&(pIVar20->profiles).stable,s_00);
      bVar13 = this->stable;
    }
    if (((bVar13 & 1) == 0) &&
       (pIVar20 = this->internal, (pIVar20->profiles).unstable.level <= iVar4)) {
      start_profiling(pIVar20,&(pIVar20->profiles).unstable,s_00);
    }
    pbVar1 = (byte *)((long)&this->mode + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  if (((this->unsat == false) && (bVar14 = terminated_asynchronously(this,1), !bVar14)) &&
     (instantiator.candidates.
      super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      instantiator.candidates.
      super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    instantiate(this,&instantiator);
  }
  std::
  _Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
  ::~_Vector_base((_Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
                   *)&instantiator);
  Eliminator::~Eliminator(&eliminator);
  return uVar21;
}

Assistant:

int Internal::elim_round (bool &completed, bool &deleted_binary_clause) {

  assert (opts.elim);
  assert (!unsat);

  START_SIMPLIFIER (elim, ELIM);
  stats.elimrounds++;

  last.elim.marked = stats.mark.elim;
  assert (!level);

  int64_t resolution_limit;

  if (opts.elimlimited) {
    int64_t delta = stats.propagations.search;
    delta *= 1e-3 * opts.elimreleff;
    if (delta < opts.elimineff)
      delta = opts.elimineff;
    if (delta > opts.elimaxeff)
      delta = opts.elimaxeff;
    delta = max (delta, (int64_t) 2l * active ());

    PHASE ("elim-round", stats.elimrounds,
           "limit of %" PRId64 " resolutions", delta);

    resolution_limit = stats.elimres + delta;
  } else {
    PHASE ("elim-round", stats.elimrounds, "resolutions unlimited");
    resolution_limit = LONG_MAX;
  }

  init_noccs ();

  // First compute the number of occurrences of each literal and at the same
  // time mark satisfied clauses and update 'elim' flags of variables in
  // clauses with root level assigned literals (both false and true).
  //
  for (const auto &c : clauses) {
    if (c->garbage || c->redundant)
      continue;
    bool satisfied = false, falsified = false;
    for (const auto &lit : *c) {
      const signed char tmp = val (lit);
      if (tmp > 0)
        satisfied = true;
      else if (tmp < 0)
        falsified = true;
      else
        assert (active (lit));
    }
    if (satisfied)
      mark_garbage (c); // forces more precise counts
    else {
      for (const auto &lit : *c) {
        if (!active (lit))
          continue;
        if (falsified)
          mark_elim (lit); // simulate unit propagation
        noccs (lit)++;
      }
    }
  }

  init_occs ();

  Eliminator eliminator (this);
  ElimSchedule &schedule = eliminator.schedule;

  // Now find elimination candidates which occurred in clauses removed since
  // the last time we ran bounded variable elimination, which in turned
  // triggered their 'elim' bit to be set.
  //
  for (auto idx : vars) {
    if (!active (idx))
      continue;
    if (frozen (idx))
      continue;
    if (!flags (idx).elim)
      continue;
    flags (idx).elim = false;
    LOG ("scheduling %d for elimination initially", idx);
    schedule.push_back (idx);
  }

  schedule.shrink ();

#ifndef QUIET
  int64_t scheduled = schedule.size ();
#endif

  PHASE ("elim-round", stats.elimrounds,
         "scheduled %" PRId64 " variables %.0f%% for elimination",
         scheduled, percent (scheduled, active ()));

  // Connect irredundant clauses.
  //
  for (const auto &c : clauses)
    if (!c->garbage && !c->redundant)
      for (const auto &lit : *c)
        if (active (lit))
          occs (lit).push_back (c);

#ifndef QUIET
  const int64_t old_resolutions = stats.elimres;
#endif
  const int old_eliminated = stats.all.eliminated;
  const int old_fixed = stats.all.fixed;

  // Limit on garbage literals during variable elimination. If the limit is
  // hit a garbage collection is performed.
  //
  const int64_t garbage_limit = (2 * stats.irrlits / 3) + (1 << 20);

  // Main loops tries to eliminate variables according to the schedule. The
  // schedule is updated dynamically and variables are potentially
  // rescheduled to be tried again if they occur in a removed clause.
  //
#ifndef QUIET
  int64_t tried = 0;
#endif
  while (!unsat && !terminated_asynchronously () &&
         stats.elimres <= resolution_limit && !schedule.empty ()) {
    int idx = schedule.front ();
    schedule.pop_front ();
    flags (idx).elim = false;
    try_to_eliminate_variable (eliminator, idx, deleted_binary_clause);
#ifndef QUIET
    tried++;
#endif
    if (stats.garbage.literals <= garbage_limit)
      continue;
    mark_redundant_clauses_with_eliminated_variables_as_garbage ();
    garbage_collection ();
  }

  // If the schedule is empty all variables have been tried (even
  // rescheduled ones).  Otherwise asynchronous termination happened or we
  // ran into the resolution limit (or derived unsatisfiability).
  //
  completed = !schedule.size ();

  PHASE ("elim-round", stats.elimrounds,
         "tried to eliminate %" PRId64 " variables %.0f%% (%zd remain)",
         tried, percent (tried, scheduled), schedule.size ());

  schedule.erase ();

  // Collect potential literal clause instantiation pairs, which needs full
  // occurrence lists and thus we have it here before resetting them.
  //
  Instantiator instantiator;
  if (!unsat && !terminated_asynchronously () && opts.instantiate)
    collect_instantiation_candidates (instantiator);

  reset_occs ();
  reset_noccs ();

  // Mark all redundant clauses with eliminated variables as garbage.
  //
  if (!unsat)
    mark_redundant_clauses_with_eliminated_variables_as_garbage ();

  int eliminated = stats.all.eliminated - old_eliminated;
#ifndef QUIET
  int64_t resolutions = stats.elimres - old_resolutions;
  PHASE ("elim-round", stats.elimrounds,
         "eliminated %d variables %.0f%% in %" PRId64 " resolutions",
         eliminated, percent (eliminated, scheduled), resolutions);
#endif

  last.elim.subsumephases = stats.subsumephases;
  const int units = stats.all.fixed - old_fixed;
  report ('e', !opts.reportall && !(eliminated + units));
  STOP_SIMPLIFIER (elim, ELIM);

  if (!unsat && !terminated_asynchronously () &&
      instantiator) // Do we have candidate pairs?
    instantiate (instantiator);

  return eliminated; // non-zero if successful
}